

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device__handle_duplex_callback_capture
                    (ma_device *pDevice,ma_uint32 frameCountInDeviceFormat,
                    void *pFramesInDeviceFormat,ma_pcm_rb *pRB)

{
  ma_uint64 mVar1;
  void *pvVar2;
  ma_uint32 mVar3;
  ma_uint32 mVar4;
  void *local_68;
  void *pFramesInClientFormat;
  ma_uint64 framesProcessedInClientFormat;
  ma_uint64 framesProcessedInDeviceFormat;
  ma_uint32 framesToProcessInClientFormat;
  ma_uint32 framesToProcessInDeviceFormat;
  void *pRunningFramesInDeviceFormat;
  ma_uint32 totalDeviceFramesProcessed;
  ma_result result;
  ma_pcm_rb *pRB_local;
  void *pFramesInDeviceFormat_local;
  ma_device *pmStack_20;
  ma_uint32 frameCountInDeviceFormat_local;
  ma_device *pDevice_local;
  ma_uint32 local_10;
  ma_format local_c;
  
  pRunningFramesInDeviceFormat._0_4_ = 0;
  _framesToProcessInClientFormat = pFramesInDeviceFormat;
  _totalDeviceFramesProcessed = pRB;
  pRB_local = (ma_pcm_rb *)pFramesInDeviceFormat;
  pFramesInDeviceFormat_local._4_4_ = frameCountInDeviceFormat;
  pmStack_20 = pDevice;
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                  ,0x2e7d,
                  "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
                 );
  }
  if (frameCountInDeviceFormat == 0) {
    __assert_fail("frameCountInDeviceFormat > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                  ,0x2e7e,
                  "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
                 );
  }
  if (pFramesInDeviceFormat == (void *)0x0) {
    __assert_fail("pFramesInDeviceFormat != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                  ,0x2e7f,
                  "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
                 );
  }
  if (pRB != (ma_pcm_rb *)0x0) {
    do {
      framesProcessedInDeviceFormat._4_4_ =
           pFramesInDeviceFormat_local._4_4_ - (int)pRunningFramesInDeviceFormat;
      local_c = (pmStack_20->capture).format;
      local_10 = (pmStack_20->capture).channels;
      mVar3 = ma_get_bytes_per_sample(local_c);
      framesProcessedInDeviceFormat._0_4_ = (uint)(0x1000 / (ulong)(mVar3 * local_10));
      pRunningFramesInDeviceFormat._4_4_ =
           ma_pcm_rb_acquire_write
                     (_totalDeviceFramesProcessed,(ma_uint32 *)&framesProcessedInDeviceFormat,
                      &local_68);
      if (pRunningFramesInDeviceFormat._4_4_ != 0) {
        ma_post_error(pmStack_20,1,"Failed to acquire capture PCM frames from ring buffer.",
                      pRunningFramesInDeviceFormat._4_4_);
        return 0;
      }
      if ((uint)framesProcessedInDeviceFormat == 0) {
        mVar3 = ma_pcm_rb_pointer_distance(_totalDeviceFramesProcessed);
        mVar4 = ma_pcm_rb_get_subbuffer_size(_totalDeviceFramesProcessed);
        if (mVar3 == mVar4) {
          return 0;
        }
      }
      framesProcessedInClientFormat = (ma_uint64)framesProcessedInDeviceFormat._4_4_;
      pFramesInClientFormat = (void *)(ulong)(uint)framesProcessedInDeviceFormat;
      pRunningFramesInDeviceFormat._4_4_ =
           ma_data_converter_process_pcm_frames
                     (&(pmStack_20->capture).converter,_framesToProcessInClientFormat,
                      &framesProcessedInClientFormat,local_68,(ma_uint64 *)&pFramesInClientFormat);
      if (pRunningFramesInDeviceFormat._4_4_ != 0) {
        return 0;
      }
      pRunningFramesInDeviceFormat._4_4_ =
           ma_pcm_rb_commit_write
                     (_totalDeviceFramesProcessed,(ma_uint32)pFramesInClientFormat,local_68);
      pvVar2 = _framesToProcessInClientFormat;
      mVar1 = framesProcessedInClientFormat;
      if (pRunningFramesInDeviceFormat._4_4_ != 0) {
        ma_post_error(pmStack_20,1,"Failed to commit capture PCM frames to ring buffer.",
                      pRunningFramesInDeviceFormat._4_4_);
        return 0;
      }
      pDevice_local._4_4_ = (pmStack_20->capture).internalFormat;
      pDevice_local._0_4_ = (pmStack_20->capture).internalChannels;
      mVar3 = ma_get_bytes_per_sample(pDevice_local._4_4_);
      _framesToProcessInClientFormat =
           (void *)((long)pvVar2 + mVar1 * (mVar3 * (ma_uint32)pDevice_local));
      pRunningFramesInDeviceFormat._0_4_ =
           (int)framesProcessedInClientFormat + (int)pRunningFramesInDeviceFormat;
    } while ((pFramesInClientFormat != (void *)0x0) || (framesProcessedInClientFormat != 0));
    return 0;
  }
  __assert_fail("pRB != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                ,0x2e80,
                "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
               );
}

Assistant:

static ma_result ma_device__handle_duplex_callback_capture(ma_device* pDevice, ma_uint32 frameCountInDeviceFormat, const void* pFramesInDeviceFormat, ma_pcm_rb* pRB)
{
    ma_result result;
    ma_uint32 totalDeviceFramesProcessed = 0;
    const void* pRunningFramesInDeviceFormat = pFramesInDeviceFormat;

    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(frameCountInDeviceFormat > 0);
    MA_ASSERT(pFramesInDeviceFormat != NULL);
    MA_ASSERT(pRB != NULL);

    /* Write to the ring buffer. The ring buffer is in the client format which means we need to convert. */
    for (;;) {
        ma_uint32 framesToProcessInDeviceFormat = (frameCountInDeviceFormat - totalDeviceFramesProcessed);
        ma_uint32 framesToProcessInClientFormat = MA_DATA_CONVERTER_STACK_BUFFER_SIZE / ma_get_bytes_per_frame(pDevice->capture.format, pDevice->capture.channels);
        ma_uint64 framesProcessedInDeviceFormat;
        ma_uint64 framesProcessedInClientFormat;
        void* pFramesInClientFormat;

        result = ma_pcm_rb_acquire_write(pRB, &framesToProcessInClientFormat, &pFramesInClientFormat);
        if (result != MA_SUCCESS) {
            ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "Failed to acquire capture PCM frames from ring buffer.", result);
            break;
        }

        if (framesToProcessInClientFormat == 0) {
            if (ma_pcm_rb_pointer_distance(pRB) == (ma_int32)ma_pcm_rb_get_subbuffer_size(pRB)) {
                break;  /* Overrun. Not enough room in the ring buffer for input frame. Excess frames are dropped. */
            }
        }

        /* Convert. */
        framesProcessedInDeviceFormat = framesToProcessInDeviceFormat;
        framesProcessedInClientFormat = framesToProcessInClientFormat;
        result = ma_data_converter_process_pcm_frames(&pDevice->capture.converter, pRunningFramesInDeviceFormat, &framesProcessedInDeviceFormat, pFramesInClientFormat, &framesProcessedInClientFormat);
        if (result != MA_SUCCESS) {
            break;
        }

        result = ma_pcm_rb_commit_write(pRB, (ma_uint32)framesProcessedInClientFormat, pFramesInClientFormat);  /* Safe cast. */
        if (result != MA_SUCCESS) {
            ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "Failed to commit capture PCM frames to ring buffer.", result);
            break;
        }

        pRunningFramesInDeviceFormat = ma_offset_ptr(pRunningFramesInDeviceFormat, framesProcessedInDeviceFormat * ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels));
        totalDeviceFramesProcessed += (ma_uint32)framesProcessedInDeviceFormat; /* Safe cast. */

        /* We're done when we're unable to process any client nor device frames. */
        if (framesProcessedInClientFormat == 0 && framesProcessedInDeviceFormat == 0) {
            break;  /* Done. */
        }
    }

    return MA_SUCCESS;
}